

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O2

int getText(char *text)

{
  uchar *__first;
  undefined8 *puVar1;
  long *plVar2;
  
  puVar1 = (undefined8 *)GGWave::rxData();
  __first = (uchar *)*puVar1;
  plVar2 = (long *)GGWave::rxData();
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<unsigned_char*,char*>
            (__first,(uchar *)((long)(int)plVar2[1] + *plVar2),text);
  return 0;
}

Assistant:

EMSCRIPTEN_KEEPALIVE
        int getText(char * text) {
            std::copy(g_ggWave->rxData().begin(), g_ggWave->rxData().end(), text);
            return 0;
        }